

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O1

uint16_t * __thiscall
icu_63::Normalizer2Impl::getCompositionsList(Normalizer2Impl *this,uint16_t norm16)

{
  ushort uVar1;
  
  uVar1 = this->minMaybeYes;
  if (this->minYesNo <= norm16 && norm16 < uVar1) {
    return (uint16_t *)
           ((long)this->extraData +
           (ulong)(*(ushort *)((long)this->extraData + (ulong)(norm16 & 0xfffe)) & 0x1f) * 2 +
           (ulong)(norm16 & 0xfffe) + 2);
  }
  if ((ushort)(norm16 + 0x400) < 0x402) {
    return (uint16_t *)0x0;
  }
  if (norm16 < uVar1) {
    return (uint16_t *)((ulong)(norm16 & 0xfffe) + (long)this->extraData);
  }
  return (uint16_t *)
         ((long)this->maybeYesCompositions + ((ulong)norm16 * 2 - (ulong)((uint)uVar1 * 2)));
}

Assistant:

const uint16_t *getCompositionsList(uint16_t norm16) const {
        return isDecompYes(norm16) ?
                getCompositionsListForDecompYes(norm16) :
                getCompositionsListForComposite(norm16);
    }